

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFParsingPath.cpp
# Opt level: O0

string * __thiscall
PDFParsingPath::PrintPath_abi_cxx11_(string *__return_storage_ptr__,PDFParsingPath *this)

{
  bool bVar1;
  reference puVar2;
  ostream *this_00;
  _Self local_1c8 [3];
  _Self local_1b0;
  _Self local_1a8;
  iterator it;
  stringstream pathWriter;
  ostream local_190 [376];
  PDFParsingPath *local_18;
  PDFParsingPath *this_local;
  
  local_18 = this;
  this_local = (PDFParsingPath *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&it);
  local_1a8._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->mObjectsPath)
  ;
  local_1b0._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->mObjectsPath);
  bVar1 = std::operator!=(&local_1a8,&local_1b0);
  if (bVar1) {
    puVar2 = std::_List_iterator<unsigned_long>::operator*(&local_1a8);
    std::ostream::operator<<(local_190,*puVar2);
    std::_List_iterator<unsigned_long>::operator++(&local_1a8);
    while( true ) {
      local_1c8[0]._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end
                     (&this->mObjectsPath);
      bVar1 = std::operator!=(&local_1a8,local_1c8);
      if (!bVar1) break;
      this_00 = std::operator<<(local_190,", ");
      puVar2 = std::_List_iterator<unsigned_long>::operator*(&local_1a8);
      std::ostream::operator<<(this_00,*puVar2);
      std::_List_iterator<unsigned_long>::operator++(&local_1a8);
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&it);
  return __return_storage_ptr__;
}

Assistant:

std::string PDFParsingPath::PrintPath() {
	std::stringstream pathWriter;
    ObjectIDTypeList::iterator it = mObjectsPath.begin();
	
    if(it != mObjectsPath.end()) {
        pathWriter<<*it;
        ++it;
        for(; it != mObjectsPath.end(); ++it) {
            pathWriter<<", "<<*it;
        }
    }

    return pathWriter.str();
}